

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::setAsUsed(CommonCore *this,BasicHandleInfo *hand)

{
  long in_RSI;
  anon_class_8_1_898c6d6d *in_RDI;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *unaff_retaddr;
  
  if ((*(byte *)(in_RSI + 0xd) & 1) == 0) {
    *(undefined1 *)(in_RSI + 0xd) = 1;
    gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
    modify<helics::CommonCore::setAsUsed(helics::BasicHandleInfo*)::__0>(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void CommonCore::setAsUsed(BasicHandleInfo* hand)
{
    assert(hand != nullptr);
    if (hand->used) {
        return;
    }
    hand->used = true;
    handles.modify([&](auto& handle) { handle.getHandleInfo(hand->handle.handle)->used = true; });
}